

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O2

int Map_LibraryReadFileTreeStr
              (Map_SuperLib_t *pLib,Mio_Library_t *pGenlib,Vec_Str_t *vStr,char *pFileName)

{
  char cVar1;
  int *piVar2;
  Map_SuperLib_t *pLib_00;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pName1;
  Map_Super_t **ppMVar6;
  Map_Super_t *pMVar7;
  ProgressBar *p;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  byte *__s;
  long lVar11;
  long lVar12;
  int nPos;
  Vec_Str_t *local_13d8;
  int *local_13d0;
  int *local_13c8;
  Map_SuperLib_t *local_13c0;
  char pBuffer [5000];
  
  nPos = 0;
  local_13d8 = vStr;
  local_13d0 = (int *)pFileName;
  local_13c0 = pLib;
  do {
    iVar3 = Vec_StrGets(pBuffer,5000,local_13d8,&nPos);
    __s = (byte *)pBuffer;
    if (iVar3 == 0) {
      return 0;
    }
    while( true ) {
      uVar10 = (ulong)*__s;
      if (0x23 < uVar10) goto LAB_003000e8;
      if ((0x100002400U >> (uVar10 & 0x3f) & 1) == 0) break;
      __s = __s + 1;
    }
  } while ((0x800000001U >> (uVar10 & 0x3f) & 1) != 0);
LAB_003000e8:
  pcVar5 = strtok((char *)__s," \t\r\n");
  pLib_00 = local_13c0;
  local_13c0->pGenlib = pGenlib;
  if (pGenlib != (Mio_Library_t *)0x0) {
    pName1 = Mio_LibraryReadName(pGenlib);
    iVar3 = Map_LibraryCompareLibNames(pName1,pcVar5);
    if (iVar3 == 0) {
      iVar3 = Vec_StrGets(pBuffer,5000,local_13d8,&nPos);
      if (iVar3 == 0) {
        return 0;
      }
      __isoc99_sscanf(pBuffer,"%d\n",&pLib_00->nVarsMax);
      if (pLib_00->nVarsMax - 0xbU < 0xfffffff7) {
        pcVar5 = "Suspicious number of variables (%d).\n";
      }
      else {
        iVar3 = Vec_StrGets(pBuffer,5000,local_13d8,&nPos);
        if (iVar3 == 0) {
          return 0;
        }
        __isoc99_sscanf(pBuffer,"%d\n",&pLib_00->nSupersReal);
        if (pLib_00->nSupersReal - 0x989681U < 0xff676980) {
          pcVar5 = "Suspicious number of gates (%d).\n";
        }
        else {
          iVar3 = Vec_StrGets(pBuffer,5000,local_13d8,&nPos);
          if (iVar3 == 0) {
            return 0;
          }
          local_13d0 = &pLib_00->nLines;
          lVar12 = 0;
          __isoc99_sscanf(pBuffer,"%d\n");
          if (0xff67697f < pLib_00->nLines - 0x989681U) {
            local_13c8 = &pLib_00->nSupersReal;
            ppMVar6 = (Map_Super_t **)malloc((ulong)(uint)pLib_00->nLines * 8 + 80000);
            pLib_00->ppSupers = ppMVar6;
            uVar9 = pLib_00->nVarsMax;
            for (; lVar12 < (int)uVar9; lVar12 = lVar12 + 1) {
              pMVar7 = (Map_Super_t *)Extra_MmFixedEntryFetch(pLib_00->mmSupers);
              memset(pMVar7,0,0x100);
              pMVar7->Num = (int)lVar12;
              pMVar7->uTruth[0] = pLib_00->uTruths[lVar12][0];
              pMVar7->uTruth[1] = pLib_00->uTruths[lVar12][1];
              uVar9 = pLib_00->nVarsMax;
              uVar10 = 0;
              if (0 < (int)uVar9) {
                uVar10 = (ulong)uVar9;
              }
              for (lVar11 = 0; uVar10 * 0xc - lVar11 != 0; lVar11 = lVar11 + 0xc) {
                *(undefined8 *)((long)&pMVar7->tDelaysR[0].Rise + lVar11) = 0xc61c3c00c61c3c00;
                *(undefined8 *)((long)&pMVar7->tDelaysF[0].Rise + lVar11) = 0xc61c3c00c61c3c00;
              }
              pMVar7->tDelaysR[lVar12].Rise = 0.0;
              pMVar7->tDelaysF[lVar12].Fall = 0.0;
              pLib_00->ppSupers[lVar12] = pMVar7;
            }
            p = Extra_ProgressBarStart(_stdout,*local_13d0);
            uVar10 = (long)(int)uVar9;
            while( true ) {
              do {
                iVar3 = Vec_StrGets(pBuffer,5000,local_13d8,&nPos);
                uVar9 = (uint)uVar10;
                pcVar5 = pBuffer;
                if (iVar3 == 0) {
                  Extra_ProgressBarStop(p);
                  piVar2 = local_13d0;
                  uVar4 = uVar9;
                  if (*local_13d0 != uVar9) {
                    printf("The number of lines read (%d) is different from what the file says (%d).\n"
                           ,uVar10 & 0xffffffff);
                    uVar4 = *piVar2;
                  }
                  piVar2 = local_13c8;
                  pLib_00->nSupersAll = uVar9;
                  uVar8 = 0;
                  uVar10 = (ulong)uVar4;
                  if ((int)uVar4 < 1) {
                    uVar10 = uVar8;
                  }
                  uVar9 = 0;
                  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
                    uVar9 = uVar9 + (*(uint *)&pLib_00->ppSupers[uVar8]->field_0x4 & 1);
                  }
                  if (uVar9 != *local_13c8) {
                    printf("The number of gates read (%d) is different what the file says (%d).\n",
                           (ulong)uVar9);
                  }
                  *piVar2 = uVar9;
                  return 1;
                }
                for (; ((cVar1 = *pcVar5, cVar1 == '\n' || (cVar1 == '\r')) || (cVar1 == ' '));
                    pcVar5 = pcVar5 + 1) {
                }
              } while (cVar1 == '\0');
              pMVar7 = Map_LibraryReadGateTree(pLib_00,pcVar5,uVar9,pLib_00->nVarsMax);
              if (pMVar7 == (Map_Super_t *)0x0) break;
              uVar8 = uVar10 + 1;
              pLib_00->ppSupers[uVar10] = pMVar7;
              uVar10 = uVar8;
              if ((p == (ProgressBar *)0x0) || ((long)p->nItemsNext <= (long)uVar8)) {
                Extra_ProgressBarUpdate_int(p,(int)uVar8,(char *)0x0);
              }
            }
            Extra_ProgressBarStop(p);
            return 0;
          }
          pcVar5 = "Suspicious number of lines (%d).\n";
        }
      }
      printf(pcVar5);
      return 0;
    }
  }
  printf("Supergate library \"%s\" requires the use of genlib library \"%s\".\n",local_13d0,pcVar5);
  return 0;
}

Assistant:

int Map_LibraryReadFileTreeStr( Map_SuperLib_t * pLib, Mio_Library_t * pGenlib, Vec_Str_t * vStr, char * pFileName )
{
    ProgressBar * pProgress;
    char pBuffer[5000];
    Map_Super_t * pGate;
    char * pTemp = 0, * pLibName;
    int nCounter, k, i;
    int RetValue, nPos = 0;

    // skip empty and comment lines
//    while ( fgets( pBuffer, 5000, pFile ) != NULL )
    while ( 1 )
    {
        RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
        if ( RetValue == 0 )
            return 0;
        // skip leading spaces
        for ( pTemp = pBuffer; *pTemp == ' ' || *pTemp == '\r' || *pTemp == '\n'; pTemp++ );
        // skip comment lines and empty lines
        if ( *pTemp != 0 && *pTemp != '#' )
            break;
    }

    pLibName = strtok( pTemp, " \t\r\n" );
//    pLib->pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
    pLib->pGenlib = pGenlib;
//    if ( pLib->pGenlib == NULL || strcmp( , pLibName ) )
    if ( pLib->pGenlib == NULL || Map_LibraryCompareLibNames(Mio_LibraryReadName(pLib->pGenlib), pLibName) )
    {
        printf( "Supergate library \"%s\" requires the use of genlib library \"%s\".\n", pFileName, pLibName );
        return 0;
    }

    // read the number of variables
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nVarsMax );
    if ( pLib->nVarsMax < 2 || pLib->nVarsMax > 10 )
    {
        printf( "Suspicious number of variables (%d).\n", pLib->nVarsMax );
        return 0;
    }

    // read the number of gates
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nSupersReal );
    if ( pLib->nSupersReal < 1 || pLib->nSupersReal > 10000000 )
    {
        printf( "Suspicious number of gates (%d).\n", pLib->nSupersReal );
        return 0;
    }

    // read the number of lines
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nLines );
    if ( pLib->nLines < 1 || pLib->nLines > 10000000 )
    {
        printf( "Suspicious number of lines (%d).\n", pLib->nLines );
        return 0;
    }

    // allocate room for supergate pointers
    pLib->ppSupers = ABC_ALLOC( Map_Super_t *, pLib->nLines + 10000 );

    // create the elementary supergates
    for ( i = 0; i < pLib->nVarsMax; i++ )
    {
        // get a new gate
        pGate = (Map_Super_t *)Extra_MmFixedEntryFetch( pLib->mmSupers );
        memset( pGate, 0, sizeof(Map_Super_t) );
        // assign the elementary variable, the truth table, and the delays
        pGate->Num = i;
        // set the truth table
        pGate->uTruth[0] = pLib->uTruths[i][0];
        pGate->uTruth[1] = pLib->uTruths[i][1];
        // set the arrival times of all input to non-existent delay
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            pGate->tDelaysR[k].Rise = pGate->tDelaysR[k].Fall = MAP_NO_VAR;
            pGate->tDelaysF[k].Rise = pGate->tDelaysF[k].Fall = MAP_NO_VAR;
        }
        // set an existent arrival time for rise and fall
        pGate->tDelaysR[i].Rise = 0.0;
        pGate->tDelaysF[i].Fall = 0.0;
        // set the gate
        pLib->ppSupers[i] = pGate;
    }

    // read the lines
    nCounter = pLib->nVarsMax;
    pProgress = Extra_ProgressBarStart( stdout, pLib->nLines );
//    while ( fgets( pBuffer, 5000, pFile ) != NULL )
    while ( Vec_StrGets( pBuffer, 5000, vStr, &nPos ) )
    {
        for ( pTemp = pBuffer; *pTemp == ' ' || *pTemp == '\r' || *pTemp == '\n'; pTemp++ );
        if ( pTemp[0] == '\0' )
            continue;
//        if ( pTemp[0] == 'a' || pTemp[2] == 'a' )
//        {
//            pLib->nLines--;
//            continue;
//        }

        // get the gate
        pGate = Map_LibraryReadGateTree( pLib, pTemp, nCounter, pLib->nVarsMax );
        if ( pGate == NULL )
        {
            Extra_ProgressBarStop( pProgress );
            return 0;
        }
        pLib->ppSupers[nCounter++] = pGate;
        // later we will derive: truth table, delays, area, number of component gates, etc

        // update the progress bar
        Extra_ProgressBarUpdate( pProgress, nCounter, NULL );
    }
    Extra_ProgressBarStop( pProgress );
    if ( nCounter != pLib->nLines )
        printf( "The number of lines read (%d) is different from what the file says (%d).\n", nCounter, pLib->nLines );
    pLib->nSupersAll = nCounter;
    // count the number of real supergates
    nCounter = 0;
    for ( k = 0; k < pLib->nLines; k++ )
        nCounter += pLib->ppSupers[k]->fSuper;
    if ( nCounter != pLib->nSupersReal )
        printf( "The number of gates read (%d) is different what the file says (%d).\n", nCounter, pLib->nSupersReal );
    pLib->nSupersReal = nCounter;
    return 1;
}